

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol_edge_state.cpp
# Opt level: O0

void EBMOL::ComputeEdgeState
               (Box *bx,Array4<double> *xedge,Array4<double> *yedge,Array4<double> *zedge,
               Array4<const_double> *q,int ncomp,Array4<const_double> *umac,
               Array4<const_double> *vmac,Array4<const_double> *wmac,Box *domain,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,Array4<const_double> *vfrac,
               Array4<const_amrex::EBCellFlag> *flag,bool is_velocity)

{
  int iVar1;
  int iVar2;
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  int *in_RDI;
  void *in_R8;
  undefined4 in_R9D;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  Box *in_stack_00000020;
  void *in_stack_00000038;
  void *in_stack_00000040;
  void *in_stack_00000048;
  void *in_stack_00000050;
  void *in_stack_00000058;
  void *in_stack_00000060;
  byte in_stack_00000068;
  bool has_extdir_or_ho_hi_z;
  bool has_extdir_or_ho_lo_z;
  pair<bool,_bool> extdir_lohi_z;
  bool has_extdir_or_ho_hi_y;
  bool has_extdir_or_ho_lo_y;
  pair<bool,_bool> extdir_lohi_y;
  bool has_extdir_or_ho_hi_x;
  bool has_extdir_or_ho_lo_x;
  pair<bool,_bool> extdir_lohi_x;
  int domain_khi;
  int domain_klo;
  int domain_jhi;
  int domain_jlo;
  int domain_ihi;
  int domain_ilo;
  Box bx_3;
  Box *wbx;
  Box bx_2;
  Box *vbx;
  Box bx_1;
  Box *ubx;
  int order;
  undefined8 in_stack_ffffffffffffeed8;
  undefined4 in_stack_ffffffffffffeee0;
  undefined4 in_stack_ffffffffffffeee4;
  undefined4 in_stack_ffffffffffffef10;
  undefined4 in_stack_ffffffffffffef14;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffef18;
  int iVar5;
  Box *pBVar4;
  undefined4 in_stack_ffffffffffffef20;
  undefined4 in_stack_ffffffffffffef24;
  undefined1 auStack_10a0 [64];
  undefined1 auStack_1060 [64];
  undefined1 auStack_1020 [64];
  undefined1 auStack_fe0 [64];
  undefined1 auStack_fa0 [64];
  undefined1 auStack_f60 [64];
  undefined1 auStack_f20 [64];
  undefined1 auStack_ee0 [64];
  undefined1 auStack_ea0 [64];
  undefined8 local_e60;
  undefined8 local_e58;
  undefined8 local_e50;
  uint local_e48;
  undefined4 local_e44;
  byte local_e40;
  undefined1 auStack_e30 [64];
  undefined1 auStack_df0 [64];
  undefined1 auStack_db0 [64];
  undefined1 auStack_d70 [64];
  undefined1 auStack_d30 [64];
  undefined1 auStack_cf0 [64];
  undefined1 auStack_cb0 [64];
  undefined1 auStack_c70 [64];
  undefined1 auStack_c30 [64];
  undefined8 local_bf0;
  undefined8 local_be8;
  undefined8 local_be0;
  uint local_bd8;
  undefined4 local_bd4;
  byte local_bd0;
  undefined1 auStack_bc0 [64];
  undefined1 auStack_b80 [64];
  undefined1 auStack_b40 [64];
  undefined1 auStack_b00 [64];
  undefined1 auStack_ac0 [64];
  undefined1 auStack_a80 [64];
  undefined1 auStack_a40 [64];
  undefined1 auStack_a00 [64];
  undefined1 auStack_9c0 [64];
  undefined8 local_980;
  undefined8 local_978;
  undefined8 local_970;
  uint local_968;
  undefined4 local_964;
  byte local_960;
  undefined1 auStack_950 [64];
  undefined1 auStack_910 [64];
  undefined1 auStack_8d0 [64];
  undefined1 auStack_890 [64];
  undefined1 auStack_850 [64];
  undefined1 auStack_810 [64];
  undefined1 auStack_7d0 [64];
  undefined1 auStack_790 [64];
  undefined8 local_750;
  undefined8 local_748;
  undefined8 local_740;
  uint local_738;
  undefined1 auStack_730 [64];
  undefined4 local_6f0;
  byte local_6ec;
  undefined1 auStack_6e0 [64];
  undefined1 auStack_6a0 [64];
  undefined1 auStack_660 [64];
  undefined1 auStack_620 [64];
  undefined1 auStack_5e0 [64];
  undefined1 auStack_5a0 [64];
  undefined1 auStack_560 [64];
  undefined1 auStack_520 [64];
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  uint local_4c8;
  undefined1 auStack_4c0 [64];
  undefined4 local_480;
  byte local_47c;
  undefined1 auStack_470 [64];
  undefined1 auStack_430 [64];
  undefined1 auStack_3f0 [64];
  undefined1 auStack_3b0 [64];
  undefined1 auStack_370 [64];
  undefined1 auStack_330 [64];
  undefined1 auStack_2f0 [64];
  undefined1 auStack_2b0 [64];
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  uint local_258;
  undefined1 auStack_250 [64];
  undefined4 local_210;
  byte local_20c;
  byte local_208;
  byte local_207;
  pair<bool,_bool> local_206;
  byte local_204;
  byte local_203;
  pair<bool,_bool> local_202;
  byte local_200;
  byte local_1ff;
  pair<bool,_bool> local_1fe;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  Box local_1e4;
  Box *local_1c8;
  Box local_1bc;
  Box *local_1a0;
  Box local_194;
  Box *local_178;
  undefined4 local_16c;
  byte local_165;
  undefined4 local_164;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  undefined4 local_134;
  undefined4 local_124;
  undefined4 local_114;
  undefined4 local_104;
  Box *local_100;
  undefined4 local_f4;
  Box *local_f0;
  undefined4 local_e4;
  Box *local_e0;
  undefined4 local_d4;
  IndexType *local_d0;
  undefined4 local_c4;
  IndexType *local_c0;
  undefined4 local_b4;
  IndexType *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  IntVect *local_a0;
  undefined4 local_98;
  undefined4 local_94;
  IntVect *local_90;
  undefined4 local_88;
  undefined4 local_84;
  IntVect *local_80;
  undefined4 local_74;
  IndexType *local_70;
  undefined4 local_64;
  IndexType *local_60;
  undefined4 local_54;
  IndexType *local_50;
  undefined4 local_44;
  IndexType *local_40;
  undefined4 local_34;
  IndexType *local_30;
  undefined4 local_24;
  IndexType *local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
  local_165 = in_stack_00000068 & 1;
  local_16c = 2;
  local_114 = 0;
  local_194.smallend.vect._0_8_ = *(undefined8 *)in_RDI;
  local_194.smallend.vect[2] = in_RDI[2];
  local_194.bigend.vect[0] = in_RDI[3];
  local_194.bigend.vect._4_8_ = *(undefined8 *)(in_RDI + 4);
  local_194.btype.itype = in_RDI[6];
  local_100 = &local_194;
  local_104 = 0;
  local_b0 = &local_194.btype;
  local_b4 = 0;
  local_44 = 0;
  local_10 = 0;
  if ((local_194.btype.itype & 1) == 0) {
    local_80 = &local_194.bigend;
    local_84 = 0;
    local_88 = 1;
    local_50 = &local_194.btype;
    local_54 = 0;
    local_c = 0;
    local_194.btype.itype = local_194.btype.itype | 1;
  }
  local_178 = &local_194;
  local_124 = 1;
  local_1bc.smallend.vect._0_8_ = *(undefined8 *)in_RDI;
  local_1bc.smallend.vect[2] = in_RDI[2];
  local_1bc.bigend.vect[0] = in_RDI[3];
  local_1bc.bigend.vect._4_8_ = *(undefined8 *)(in_RDI + 4);
  local_1bc.btype.itype = in_RDI[6];
  local_f0 = &local_1bc;
  local_f4 = 1;
  local_c0 = &local_1bc.btype;
  local_c4 = 1;
  local_34 = 1;
  local_14 = 1;
  if ((local_1bc.btype.itype & 2) == 0) {
    local_90 = &local_1bc.bigend;
    local_94 = 1;
    local_98 = 1;
    local_60 = &local_1bc.btype;
    local_64 = 1;
    local_8 = 1;
    local_1bc.btype.itype = local_1bc.btype.itype | 2;
  }
  local_1a0 = &local_1bc;
  local_134 = 2;
  local_1e4.smallend.vect._0_8_ = *(undefined8 *)in_RDI;
  local_1e4.smallend.vect[2] = in_RDI[2];
  local_1e4.bigend.vect[0] = in_RDI[3];
  local_1e4.bigend.vect._4_8_ = *(undefined8 *)(in_RDI + 4);
  local_1e4.btype.itype = in_RDI[6];
  local_e0 = &local_1e4;
  local_e4 = 2;
  local_d0 = &local_1e4.btype;
  local_d4 = 2;
  local_24 = 2;
  local_18 = 2;
  if ((local_1e4.btype.itype & 4) == 0) {
    local_a0 = &local_1e4.bigend;
    local_a4 = 2;
    local_a8 = 1;
    local_70 = &local_1e4.btype;
    local_74 = 2;
    local_4 = 2;
    local_1e4.btype.itype = local_1e4.btype.itype | 4;
  }
  local_1c8 = &local_1e4;
  local_164 = in_R9D;
  local_160 = in_R8;
  local_158 = in_RCX;
  local_150 = in_RDX;
  local_148 = in_RSI;
  local_40 = local_b0;
  local_30 = local_c0;
  local_20 = local_d0;
  local_1e8 = amrex::Box::smallEnd(in_stack_00000020,0);
  local_1ec = amrex::Box::bigEnd(in_stack_00000020,0);
  local_1f0 = amrex::Box::smallEnd(in_stack_00000020,1);
  local_1f4 = amrex::Box::bigEnd(in_stack_00000020,1);
  local_1f8 = amrex::Box::smallEnd(in_stack_00000020,2);
  local_1fc = amrex::Box::bigEnd(in_stack_00000020,2);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xf62c88);
  local_1fe = anon_unknown.dwarf_7b5d56::has_extdir_or_ho
                        ((BCRec *)CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
                         (int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
                         (int)in_stack_ffffffffffffeed8);
  local_1ff = local_1fe.first & 1;
  local_200 = local_1fe.second & 1;
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xf62cce);
  local_202 = anon_unknown.dwarf_7b5d56::has_extdir_or_ho
                        ((BCRec *)CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
                         (int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
                         (int)in_stack_ffffffffffffeed8);
  local_203 = local_202.first & 1;
  local_204 = local_202.second & 1;
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xf62d17);
  local_206 = anon_unknown.dwarf_7b5d56::has_extdir_or_ho
                        ((BCRec *)CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
                         (int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
                         (int)in_stack_ffffffffffffeed8);
  iVar1 = local_1e8;
  local_207 = local_206.first & 1;
  local_208 = local_206.second & 1;
  if ((local_1ff & 1) == 0) {
LAB_00f62d88:
    iVar1 = local_1ec;
    if ((local_200 & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_178,0);
      if (iVar1 <= iVar2) goto LAB_00f62e90;
    }
    iVar1 = local_1f0;
    if ((local_203 & 1) != 0) {
      iVar2 = amrex::Box::smallEnd(local_1a0,1);
      if (iVar2 + -1 <= iVar1) goto LAB_00f62e90;
    }
    iVar1 = local_1f4;
    if ((local_204 & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_1a0,1);
      if (iVar1 <= iVar2) goto LAB_00f62e90;
    }
    iVar1 = local_1f8;
    if ((local_207 & 1) != 0) {
      iVar2 = amrex::Box::smallEnd(local_1c8,2);
      if (iVar2 + -1 <= iVar1) goto LAB_00f62e90;
    }
    iVar1 = local_1fc;
    if ((local_208 & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_1c8,2);
      if (iVar1 <= iVar2) goto LAB_00f62e90;
    }
    memcpy(auStack_bc0,local_160,0x3c);
    memcpy(auStack_b80,in_stack_00000050,0x3c);
    memcpy(auStack_b40,in_stack_00000038,0x3c);
    memcpy(auStack_b00,in_stack_00000040,0x3c);
    memcpy(auStack_ac0,in_stack_00000048,0x3c);
    memcpy(auStack_a80,in_stack_00000060,0x3c);
    memcpy(auStack_a40,in_stack_00000008,0x3c);
    memcpy(auStack_a00,local_148,0x3c);
    memcpy(auStack_9c0,in_stack_00000058,0x3c);
    local_980 = *(undefined8 *)(in_stack_00000020->smallend).vect;
    local_978 = *(undefined8 *)((in_stack_00000020->smallend).vect + 2);
    local_970 = *(undefined8 *)((in_stack_00000020->bigend).vect + 1);
    local_968 = (in_stack_00000020->btype).itype;
    local_964 = local_16c;
    local_960 = local_165 & 1;
    amrex::
    ParallelFor<int,EBMOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,bool)::__3,void>
              ((Box *)CONCAT44(in_stack_ffffffffffffef24,in_stack_ffffffffffffef20),iVar5,
               (anon_class_624_13_2da88530 *)
               CONCAT44(in_stack_ffffffffffffef14,in_stack_ffffffffffffef10));
    memcpy(auStack_e30,local_160,0x3c);
    memcpy(auStack_df0,in_stack_00000050,0x3c);
    memcpy(auStack_db0,in_stack_00000038,0x3c);
    memcpy(auStack_d70,in_stack_00000040,0x3c);
    memcpy(auStack_d30,in_stack_00000048,0x3c);
    memcpy(auStack_cf0,in_stack_00000060,0x3c);
    memcpy(auStack_cb0,in_stack_00000010,0x3c);
    memcpy(auStack_c70,local_150,0x3c);
    memcpy(auStack_c30,in_stack_00000058,0x3c);
    local_bf0 = *(undefined8 *)(in_stack_00000020->smallend).vect;
    local_be8 = *(undefined8 *)((in_stack_00000020->smallend).vect + 2);
    local_be0 = *(undefined8 *)((in_stack_00000020->bigend).vect + 1);
    local_bd8 = (in_stack_00000020->btype).itype;
    local_bd4 = local_16c;
    local_bd0 = local_165 & 1;
    amrex::
    ParallelFor<int,EBMOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,bool)::__4,void>
              ((Box *)CONCAT44(in_stack_ffffffffffffef24,in_stack_ffffffffffffef20),iVar5,
               (anon_class_624_13_56316332 *)
               CONCAT44(in_stack_ffffffffffffef14,in_stack_ffffffffffffef10));
    memcpy(auStack_10a0,local_160,0x3c);
    memcpy(auStack_1060,in_stack_00000050,0x3c);
    memcpy(auStack_1020,in_stack_00000038,0x3c);
    memcpy(auStack_fe0,in_stack_00000040,0x3c);
    memcpy(auStack_fa0,in_stack_00000048,0x3c);
    memcpy(auStack_f60,in_stack_00000060,0x3c);
    memcpy(auStack_f20,in_stack_00000018,0x3c);
    memcpy(auStack_ee0,local_158,0x3c);
    memcpy(auStack_ea0,in_stack_00000058,0x3c);
    local_e60 = *(undefined8 *)(in_stack_00000020->smallend).vect;
    local_e58 = *(undefined8 *)((in_stack_00000020->smallend).vect + 2);
    local_e50 = *(undefined8 *)((in_stack_00000020->bigend).vect + 1);
    local_e48 = (in_stack_00000020->btype).itype;
    local_e44 = local_16c;
    local_e40 = local_165 & 1;
    amrex::
    ParallelFor<int,EBMOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,bool)::__5,void>
              ((Box *)CONCAT44(in_stack_ffffffffffffef24,in_stack_ffffffffffffef20),iVar5,
               (anon_class_624_13_7eba4134 *)
               CONCAT44(in_stack_ffffffffffffef14,in_stack_ffffffffffffef10));
  }
  else {
    iVar2 = amrex::Box::smallEnd(local_178,0);
    if (iVar1 < iVar2 + -1) goto LAB_00f62d88;
LAB_00f62e90:
    memcpy(auStack_470,local_160,0x3c);
    memcpy(auStack_430,in_stack_00000050,0x3c);
    memcpy(auStack_3f0,in_stack_00000038,0x3c);
    memcpy(auStack_3b0,in_stack_00000040,0x3c);
    memcpy(auStack_370,in_stack_00000048,0x3c);
    memcpy(auStack_330,in_stack_00000060,0x3c);
    memcpy(auStack_2f0,in_stack_00000008,0x3c);
    memcpy(auStack_2b0,local_148,0x3c);
    local_270 = *(undefined8 *)(in_stack_00000020->smallend).vect;
    local_268 = *(undefined8 *)((in_stack_00000020->smallend).vect + 2);
    local_260 = *(undefined8 *)((in_stack_00000020->bigend).vect + 1);
    local_258 = (in_stack_00000020->btype).itype;
    memcpy(auStack_250,in_stack_00000058,0x3c);
    local_210 = local_16c;
    local_20c = local_165 & 1;
    amrex::
    ParallelFor<int,EBMOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,bool)::__0,void>
              ((Box *)CONCAT44(in_stack_ffffffffffffef24,in_stack_ffffffffffffef20),iVar5,
               (anon_class_624_13_64a6b87d *)
               CONCAT44(in_stack_ffffffffffffef14,in_stack_ffffffffffffef10));
    uVar3 = local_164;
    memcpy(auStack_6e0,local_160,0x3c);
    memcpy(auStack_6a0,in_stack_00000050,0x3c);
    memcpy(auStack_660,in_stack_00000038,0x3c);
    memcpy(auStack_620,in_stack_00000040,0x3c);
    memcpy(auStack_5e0,in_stack_00000048,0x3c);
    memcpy(auStack_5a0,in_stack_00000060,0x3c);
    memcpy(auStack_560,in_stack_00000010,0x3c);
    memcpy(auStack_520,local_150,0x3c);
    local_4e0 = *(undefined8 *)(in_stack_00000020->smallend).vect;
    local_4d8 = *(undefined8 *)((in_stack_00000020->smallend).vect + 2);
    local_4d0 = *(undefined8 *)((in_stack_00000020->bigend).vect + 1);
    local_4c8 = (in_stack_00000020->btype).itype;
    memcpy(auStack_4c0,in_stack_00000058,0x3c);
    local_480 = local_16c;
    local_47c = local_165 & 1;
    amrex::
    ParallelFor<int,EBMOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,bool)::__1,void>
              ((Box *)CONCAT44(in_stack_ffffffffffffef24,in_stack_ffffffffffffef20),iVar5,
               (anon_class_624_13_8d2f967f *)CONCAT44(uVar3,in_stack_ffffffffffffef10));
    pBVar4 = local_1c8;
    memcpy(auStack_950,local_160,0x3c);
    iVar5 = (int)((ulong)pBVar4 >> 0x20);
    memcpy(auStack_910,in_stack_00000050,0x3c);
    memcpy(auStack_8d0,in_stack_00000038,0x3c);
    memcpy(auStack_890,in_stack_00000040,0x3c);
    memcpy(auStack_850,in_stack_00000048,0x3c);
    memcpy(auStack_810,in_stack_00000060,0x3c);
    memcpy(auStack_7d0,in_stack_00000018,0x3c);
    memcpy(auStack_790,local_158,0x3c);
    local_750 = *(undefined8 *)(in_stack_00000020->smallend).vect;
    local_748 = *(undefined8 *)((in_stack_00000020->smallend).vect + 2);
    local_740 = *(undefined8 *)((in_stack_00000020->bigend).vect + 1);
    local_738 = (in_stack_00000020->btype).itype;
    memcpy(auStack_730,in_stack_00000058,0x3c);
    local_6f0 = local_16c;
    local_6ec = local_165 & 1;
    amrex::
    ParallelFor<int,EBMOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,bool)::__2,void>
              ((Box *)CONCAT44(local_164,in_stack_ffffffffffffef20),iVar5,
               (anon_class_624_13_b5b87481 *)CONCAT44(uVar3,in_stack_ffffffffffffef10));
  }
  return;
}

Assistant:

void
EBMOL::ComputeEdgeState ( Box const& bx,
                          AMREX_D_DECL( Array4<Real> const& xedge,
                                        Array4<Real> const& yedge,
                                        Array4<Real> const& zedge),
                          Array4<Real const> const& q,
                          const int ncomp,
                          AMREX_D_DECL( Array4<Real const> const& umac,
                                        Array4<Real const> const& vmac,
                                        Array4<Real const> const& wmac),
                          const Box&       domain,
                          const Vector<BCRec>& bcs,
                          const        BCRec * d_bcrec_ptr,
                          AMREX_D_DECL( Array4<Real const> const& fcx,
                                        Array4<Real const> const& fcy,
                                        Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Array4<Real const> const& vfrac,
                          Array4<EBCellFlag const> const& flag,
                          const bool is_velocity)
{

    int order = 2;

    AMREX_D_TERM( const Box& ubx = amrex::surroundingNodes(bx,0);,
                  const Box& vbx = amrex::surroundingNodes(bx,1);,
                  const Box& wbx = amrex::surroundingNodes(bx,2););

    AMREX_D_TERM(
        const int domain_ilo = domain.smallEnd(0);
        const int domain_ihi = domain.bigEnd(0);,
        const int domain_jlo = domain.smallEnd(1);
        const int domain_jhi = domain.bigEnd(1);,
        const int domain_klo = domain.smallEnd(2);
        const int domain_khi = domain.bigEnd(2););

    // ****************************************************************************
    // Decide whether the stencil at each cell might need to see values that
    //     live on face centroids rather than cell centroids, i.e.
    //     are at a domain boundary with ext_dir or hoextrap boundary conditions
    // ****************************************************************************

    auto extdir_lohi_x = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;

    auto extdir_lohi_y = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif


    if ((has_extdir_or_ho_lo_x && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {

        // ****************************************************************************
        // Predict to x-faces
        // ****************************************************************************
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,umac, xedge, domain, vfrac, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           if (flag(i,j,k).isConnected(-1,0,0))
           {
               xedge(i,j,k,n) = EBMOL::hydro_ebmol_xedge_state_extdir( AMREX_D_DECL(i, j, k), n, q, umac,
                                                                       AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                       flag, d_bcrec_ptr, domain, order, is_velocity );
           }
           else
           {
               xedge(i,j,k,n) = 0.0;
           }
        });

        // ****************************************************************************
        // Predict to y-faces
        // ****************************************************************************
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,vmac,yedge,domain,vfrac,order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                yedge(i,j,k,n) = EBMOL::hydro_ebmol_yedge_state_extdir( AMREX_D_DECL(i, j, k), n, q, vmac,
                                        AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                        flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                yedge(i,j,k,n) = 0.0;
            }
        });

#if ( AMREX_SPACEDIM == 3 )
        // ****************************************************************************
        // Predict to z-faces
        // ****************************************************************************
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,wmac,zedge,domain,vfrac,order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                zedge(i,j,k,n) = EBMOL::hydro_ebmol_zedge_state_extdir( i, j, k, n, q, wmac,
                                        AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                        flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                zedge(i,j,k,n) = 0.0;
            }
        });
#endif
    }
    else // We assume below that the stencil does not need to use hoextrap or extdir boundaries
    {
        // ****************************************************************************
        // Predict to x-faces
        // ****************************************************************************
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, umac, xedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           if (flag(i,j,k).isConnected(-1,0,0))
           {
                xedge(i,j,k,n) = EBMOL::hydro_ebmol_xedge_state( AMREX_D_DECL(i, j, k), n, q, umac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
           }
           else
           {
                xedge(i,j,k,n) = 0.0;
           }
        });

        // ****************************************************************************
        // Predict to y-faces
        // ****************************************************************************
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, vmac, yedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                yedge(i,j,k,n) = EBMOL::hydro_ebmol_yedge_state( AMREX_D_DECL(i, j, k), n, q, vmac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                yedge(i,j,k,n) = 0.0;
            }
        });

#if ( AMREX_SPACEDIM == 3 )
        // ****************************************************************************
        // Predict to z-faces
        // ****************************************************************************
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, wmac, zedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                zedge(i,j,k,n) = EBMOL::hydro_ebmol_zedge_state( AMREX_D_DECL(i, j, k), n, q, wmac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                zedge(i,j,k,n) = 0.0;
            }
        });
#endif
    }

}